

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void sarima_setMethod(sarima_object obj,int value)

{
  int value_local;
  sarima_object obj_local;
  
  if (value == 0) {
    obj->method = 0;
  }
  else if (value == 1) {
    obj->method = 1;
  }
  else if (value == 2) {
    obj->method = 2;
  }
  else {
    printf("\n Acceptable Numerical Values 0 - MLE, 1 - CSS, 2 - Box-Jenkins \n");
  }
  return;
}

Assistant:

void sarima_setMethod(sarima_object obj, int value) {
	if (value == 0) {
		obj->method = 0;
	}
	else if (value == 1) {
		obj->method = 1;
	}
	else if (value == 2) {
		obj->method = 2;
	}
	else {
		printf("\n Acceptable Numerical Values 0 - MLE, 1 - CSS, 2 - Box-Jenkins \n");
	}
}